

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marray.hxx
# Opt level: O2

size_t * __thiscall
andres::
UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
::shapeBegin(UnaryViewExpression<andres::View<int,_true,_std::allocator<unsigned_long>_>,_int,_andres::marray_detail::Negate<int>_>
             *this)

{
  size_t *psVar1;
  
  psVar1 = View<int,_true,_std::allocator<unsigned_long>_>::shapeBegin(this->e_);
  return psVar1;
}

Assistant:

const std::size_t* shapeBegin() const 
        { return e_.shapeBegin(); }